

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

void __thiscall Hospital::Hospital(Hospital *this)

{
  (this->Admin_Username)._M_dataplus._M_p = (pointer)&(this->Admin_Username).field_2;
  (this->Admin_Username)._M_string_length = 0;
  (this->Admin_Username).field_2._M_local_buf[0] = '\0';
  (this->Admin_Password)._M_dataplus._M_p = (pointer)&(this->Admin_Password).field_2;
  (this->Admin_Password)._M_string_length = 0;
  (this->Admin_Password).field_2._M_local_buf[0] = '\0';
  (this->All_Of_Doctors).super__Vector_base<Doctor,_std::allocator<Doctor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->All_Of_Doctors).super__Vector_base<Doctor,_std::allocator<Doctor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->All_Of_Doctors).super__Vector_base<Doctor,_std::allocator<Doctor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->All_Of_Nurses).super__Vector_base<Nurse,_std::allocator<Nurse>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->All_Of_Nurses).super__Vector_base<Nurse,_std::allocator<Nurse>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->All_Of_Nurses).super__Vector_base<Nurse,_std::allocator<Nurse>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->All_Of_Patients).super__Vector_base<Patient,_std::allocator<Patient>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->All_Of_Patients).super__Vector_base<Patient,_std::allocator<Patient>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->All_Of_Patients).super__Vector_base<Patient,_std::allocator<Patient>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::assign((char *)this);
  std::__cxx11::string::assign((char *)&this->Admin_Password);
  return;
}

Assistant:

Hospital :: Hospital() {
    Admin_Username = "123";
    Admin_Password = "78";
}